

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O0

bool loadSceneFramebufferTexture(void)

{
  GLboolean GVar1;
  GLenum GVar2;
  uint local_10;
  uint local_c;
  int maxSamples;
  int samples;
  
  GVar1 = (*glad_glIsTexture)(g_gl.textures[1]);
  if (GVar1 != '\0') {
    (*glad_glDeleteTextures)(1,g_gl.textures + 1);
  }
  GVar1 = (*glad_glIsTexture)(g_gl.textures[2]);
  if (GVar1 != '\0') {
    (*glad_glDeleteTextures)(1,g_gl.textures + 2);
  }
  (*glad_glGenTextures)(1,g_gl.textures + 2);
  (*glad_glGenTextures)(1,g_gl.textures + 1);
  if (g_framebuffer.aa == 0) {
    fprintf(_stdout,"Loading {Scene-Z-Framebuffer-Texture}\n");
    fflush(_stdout);
    (*glad_glActiveTexture)(0x84c2);
    (*glad_glBindTexture)(0xde1,g_gl.textures[2]);
    (*glad_glTexStorage2D)(0xde1,1,0x88f0,g_framebuffer.w,g_framebuffer.h);
    (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
    (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
    fprintf(_stdout,"Loading {Scene-RGBA-Framebuffer-Texture}\n");
    fflush(_stdout);
    (*glad_glActiveTexture)(0x84c1);
    (*glad_glBindTexture)(0xde1,g_gl.textures[1]);
    (*glad_glTexStorage2D)(0xde1,1,0x8814,g_framebuffer.w,g_framebuffer.h);
    (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
    (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
  }
  else if (g_framebuffer.aa - 1U < 4) {
    local_c = 1 << ((byte)g_framebuffer.aa & 0x1f);
    (*glad_glGetIntegerv)(0x9110,(GLint *)&local_10);
    if ((int)local_10 < (int)local_c) {
      fprintf(_stdout,"note: MSAA is %ix\n",(ulong)local_10);
      fflush(_stdout);
      local_c = local_10;
    }
    fprintf(_stdout,"Loading {Scene-MSAA-Z-Framebuffer-Texture}\n");
    fflush(_stdout);
    (*glad_glActiveTexture)(0x84c2);
    (*glad_glBindTexture)(0x9100,g_gl.textures[2]);
    (*glad_glTexStorage2DMultisample)
              (0x9100,local_c,0x88f0,g_framebuffer.w,g_framebuffer.h,
               (GLboolean)g_framebuffer.msaa.fixed);
    fprintf(_stdout,"Loading {Scene-MSAA-RGBA-Framebuffer-Texture}\n");
    fflush(_stdout);
    (*glad_glActiveTexture)(0x84c1);
    (*glad_glBindTexture)(0x9100,g_gl.textures[1]);
    (*glad_glTexStorage2DMultisample)
              (0x9100,local_c,0x8814,g_framebuffer.w,g_framebuffer.h,
               (GLboolean)g_framebuffer.msaa.fixed);
  }
  (*glad_glActiveTexture)(0x84c0);
  GVar2 = (*glad_glGetError)();
  return GVar2 == 0;
}

Assistant:

bool loadSceneFramebufferTexture()
{
    if (glIsTexture(g_gl.textures[TEXTURE_SCENE]))
        glDeleteTextures(1, &g_gl.textures[TEXTURE_SCENE]);
    if (glIsTexture(g_gl.textures[TEXTURE_Z]))
        glDeleteTextures(1, &g_gl.textures[TEXTURE_Z]);
    glGenTextures(1, &g_gl.textures[TEXTURE_Z]);
    glGenTextures(1, &g_gl.textures[TEXTURE_SCENE]);

    switch (g_framebuffer.aa) {
        case AA_NONE:
            LOG("Loading {Scene-Z-Framebuffer-Texture}\n");
            glActiveTexture(GL_TEXTURE0 + TEXTURE_Z);
            glBindTexture(GL_TEXTURE_2D, g_gl.textures[TEXTURE_Z]);
            glTexStorage2D(GL_TEXTURE_2D,
                           1,
                           GL_DEPTH24_STENCIL8,
                           g_framebuffer.w,
                           g_framebuffer.h);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

            LOG("Loading {Scene-RGBA-Framebuffer-Texture}\n");
            glActiveTexture(GL_TEXTURE0 + TEXTURE_SCENE);
            glBindTexture(GL_TEXTURE_2D, g_gl.textures[TEXTURE_SCENE]);
            glTexStorage2D(GL_TEXTURE_2D,
                           1,
                           GL_RGBA32F,
                           g_framebuffer.w,
                           g_framebuffer.h);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
            break;
        case AA_MSAA2:
        case AA_MSAA4:
        case AA_MSAA8:
        case AA_MSAA16: {
            int samples = 1 << g_framebuffer.aa;
            int maxSamples;

            glGetIntegerv(GL_MAX_INTEGER_SAMPLES, &maxSamples);
            if (samples > maxSamples) {
                LOG("note: MSAA is %ix\n", maxSamples);
                samples = maxSamples;
            }
            LOG("Loading {Scene-MSAA-Z-Framebuffer-Texture}\n");
            glActiveTexture(GL_TEXTURE0 + TEXTURE_Z);
            glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, g_gl.textures[TEXTURE_Z]);
            glTexStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE,
                                      samples,
                                      GL_DEPTH24_STENCIL8,
                                      g_framebuffer.w,
                                      g_framebuffer.h,
                                      g_framebuffer.msaa.fixed);

            LOG("Loading {Scene-MSAA-RGBA-Framebuffer-Texture}\n");
            glActiveTexture(GL_TEXTURE0 + TEXTURE_SCENE);
            glBindTexture(GL_TEXTURE_2D_MULTISAMPLE,
                          g_gl.textures[TEXTURE_SCENE]);
            glTexStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE,
                                      samples,
                                      GL_RGBA32F,
                                      g_framebuffer.w,
                                      g_framebuffer.h,
                                      g_framebuffer.msaa.fixed);
        } break;
    }
    glActiveTexture(GL_TEXTURE0);

    return (glGetError() == GL_NO_ERROR);
}